

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::set_replacestringvalue(Imputer *this,string *value)

{
  bool bVar1;
  string *psVar2;
  string *value_local;
  Imputer *this_local;
  
  bVar1 = has_replacestringvalue(this);
  if (!bVar1) {
    clear_ReplaceValue(this);
    set_has_replacestringvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->ReplaceValue_).replacestringvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->ReplaceValue_).replacestringvalue_,psVar2,value);
  return;
}

Assistant:

inline void Imputer::set_replacestringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.replaceStringValue)
  if (!has_replacestringvalue()) {
    clear_ReplaceValue();
    set_has_replacestringvalue();
    ReplaceValue_.replacestringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  ReplaceValue_.replacestringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.replaceStringValue)
}